

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O1

void tchecker::log_output_count(ostream *os)

{
  ostream *poVar1;
  
  if (_log_error_count != 0) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," error(s)",9);
  }
  if ((_log_error_count != 0) && (_log_warning_count != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(os," and ",5);
  }
  if (_log_warning_count != 0) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," warning(s)",0xb);
  }
  if (_log_warning_count != 0 || _log_error_count != 0) {
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void log_output_count(std::ostream & os)
{
  if (tchecker::_log_error_count > 0)
    os << tchecker::_log_error_count << " error(s)";
  if (tchecker::_log_error_count > 0 && tchecker::_log_warning_count > 0)
    os << " and ";
  if (tchecker::_log_warning_count > 0)
    os << tchecker::_log_warning_count << " warning(s)";
  if (tchecker::_log_error_count > 0 || tchecker::_log_warning_count > 0)
    os << std::endl;
}